

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::SimpleShaders::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430                         \nin vec4 position;                    \nvoid main(void)                      \n{                                    \n    gl_Position = position;          \n}"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                         \n"
			   "in vec4 position;                    \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    gl_Position = position;          \n"
			   "}";
	}